

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void __thiscall
pybind11::detail::values_and_holders::values_and_holders(values_and_holders *this,PyObject *obj)

{
  bool bVar1;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar2;
  PyObject *obj_local;
  values_and_holders *this_local;
  
  this->inst = (instance *)0x0;
  pvVar2 = all_type_info(obj->ob_type);
  this->tinfo = pvVar2;
  bVar1 = std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
          ::empty(this->tinfo);
  if (!bVar1) {
    this->inst = (instance *)obj;
  }
  return;
}

Assistant:

explicit values_and_holders(PyObject *obj)
        : inst{nullptr}, tinfo(all_type_info(Py_TYPE(obj))) {
        if (!tinfo.empty()) {
            inst = reinterpret_cast<instance *>(obj);
        }
    }